

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

void __thiscall
libDAI::MaxPlus::SetAnyTimeResults(MaxPlus *this,bool turn_on,ofstream *results,ofstream *timings)

{
  undefined3 in_register_00000031;
  
  this->writeAnyTimeResults = turn_on;
  if (CONCAT31(in_register_00000031,turn_on) == 0) {
    timings = (ofstream *)0x0;
    results = (ofstream *)0x0;
  }
  this->results_f = results;
  this->timings_f = timings;
  return;
}

Assistant:

void MaxPlus::SetAnyTimeResults(bool turn_on, 
            ofstream* results, ofstream* timings)
    {
        writeAnyTimeResults = turn_on;
        if(turn_on)
        {
            results_f = results;
            timings_f = timings;         
        }
        else
        {
            results_f = NULL;
            timings_f = NULL;
        }

    }